

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseBase.h
# Opt level: O0

void __thiscall
Eigen::
DenseBase<Eigen::CwiseNullaryOp<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/tests/point_source_panner_tests.cpp:35:17),_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
::DenseBase(DenseBase<Eigen::CwiseNullaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_tests_point_source_panner_tests_cpp:35:17),_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
            *this)

{
  DenseBase<Eigen::CwiseNullaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ebu[P]libear_tests_point_source_panner_tests_cpp:35:17),_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
  *this_local;
  
  return;
}

Assistant:

EIGEN_DEVICE_FUNC DenseBase()
    {
      /* Just checks for self-consistency of the flags.
       * Only do it when debugging Eigen, as this borders on paranoia and could slow compilation down
       */
#ifdef EIGEN_INTERNAL_DEBUGGING
      EIGEN_STATIC_ASSERT((EIGEN_IMPLIES(MaxRowsAtCompileTime==1 && MaxColsAtCompileTime!=1, int(IsRowMajor))
                        && EIGEN_IMPLIES(MaxColsAtCompileTime==1 && MaxRowsAtCompileTime!=1, int(!IsRowMajor))),
                          INVALID_STORAGE_ORDER_FOR_THIS_VECTOR_EXPRESSION)
#endif
    }